

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpparser.c
# Opt level: O3

void parser_response_init(http_parser_t *parser,http_method_t request_method)

{
  memset(parser,0,0x1f0);
  parser->http_error_code = 400;
  parser->ent_position = 1;
  httpmsg_init(&parser->msg);
  (parser->scanner).cursor = 0;
  (parser->scanner).msg = &(parser->msg).msg;
  (parser->scanner).entire_msg_loaded = 0;
  (parser->msg).is_request = 0;
  (parser->msg).request_method = request_method;
  (parser->msg).amount_discarded = 0;
  parser->position = POS_RESPONSE_LINE;
  return;
}

Assistant:

void parser_response_init(http_parser_t *parser, http_method_t request_method)
{
	parser_init(parser);
	parser->msg.is_request = 0;
	parser->msg.request_method = request_method;
	parser->msg.amount_discarded = (size_t)0;
	parser->position = POS_RESPONSE_LINE;
}